

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O1

bool __thiscall relive::Player::hasSource(Player *this)

{
  pthread_mutex_t *__mutex;
  impl *piVar1;
  size_type sVar2;
  int iVar3;
  bool bVar4;
  string local_40;
  
  __mutex = (pthread_mutex_t *)
            (this->_impl)._M_t.
            super___uniq_ptr_impl<relive::Player::impl,_std::default_delete<relive::Player::impl>_>.
            _M_t.
            super__Tuple_impl<0UL,_relive::Player::impl_*,_std::default_delete<relive::Player::impl>_>
            .super__Head_base<0UL,_relive::Player::impl_*,_false>._M_head_impl;
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 == 0) {
    piVar1 = (this->_impl)._M_t.
             super___uniq_ptr_impl<relive::Player::impl,_std::default_delete<relive::Player::impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_relive::Player::impl_*,_std::default_delete<relive::Player::impl>_>
             .super__Head_base<0UL,_relive::Player::impl_*,_false>._M_head_impl;
    sVar2 = *(size_type *)((long)&(piVar1->_source)._scheme + 8);
    bVar4 = true;
    if (sVar2 == 0) {
      ghc::net::uri::authority_abi_cxx11_(&local_40,&piVar1->_source);
      if (((local_40._M_string_length == 0) &&
          (*(size_type *)((long)&(piVar1->_source)._path + 8) == 0)) &&
         (*(size_type *)((long)&(piVar1->_source)._query + 8) == 0)) {
        bVar4 = *(size_type *)((long)&(piVar1->_source)._fragment + 8) != 0;
      }
    }
    if ((sVar2 == 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2)) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    pthread_mutex_unlock(__mutex);
    return bVar4;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

bool Player::hasSource() const
{
    std::scoped_lock lock{_impl->_mutex};
    return !_impl->_source.empty();
}